

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_drawWalls(bool allmap)

{
  double *pdVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  sector_t_conflict *psVar6;
  long lVar7;
  uint uVar8;
  AMColor *this;
  long lVar9;
  uint uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  int lock;
  AMColor c;
  int local_44;
  ulong local_40;
  AMColor local_38;
  
  uVar8 = 0;
  if (am_portaloverlay.Value) {
    uVar8 = Displacements.size;
  }
  uVar3 = (ulong)uVar8;
  do {
    do {
      local_40 = uVar3;
      if ((int)local_40 < 0) {
        return;
      }
      uVar10 = (int)local_40 - 1;
      uVar3 = (ulong)uVar10;
    } while (uVar10 == MapPortalGroup);
    lVar7 = 0;
    for (lVar9 = 0; lVar9 < numlines; lVar9 = lVar9 + 1) {
      if ((*(byte *)(*(long *)((long)lines->sidedef + lVar7) + 0xb4) & 0x40) == 0) {
        psVar6 = *(sector_t_conflict **)((long)lines->bbox + lVar7 + 0x20);
      }
      else {
        pdVar1 = *(double **)((long)lines->args + lVar7 + -0x2c);
        psVar6 = P_PointInSector(*(double *)((long)lines->args + lVar7 + -0x1c) * 0.5 + *pdVar1,
                                 *(double *)((long)lines->args + lVar7 + -0x14) * 0.5 + pdVar1[1]);
      }
      uVar5 = psVar6->PortalGroup;
      bVar11 = uVar5 == MapPortalGroup;
      if (uVar5 == uVar10) {
        dVar12 = 0.0;
        dVar13 = 0.0;
        if (uVar10 != MapPortalGroup) {
          dVar12 = Displacements.data.Array[(int)(MapPortalGroup * Displacements.size + uVar10)].pos
                   .X;
          dVar13 = Displacements.data.Array[(int)(MapPortalGroup * Displacements.size + uVar10)].pos
                   .Y;
        }
LAB_00365dd7:
        pdVar1 = *(double **)((long)lines->args + lVar7 + -0x2c);
        AM_drawWalls::l.a.y = pdVar1[1] + dVar13;
        AM_drawWalls::l.a.x = *pdVar1 + dVar12;
        pdVar1 = *(double **)((long)lines->args + lVar7 + -0x24);
        AM_drawWalls::l.b.y = pdVar1[1] + dVar13;
        AM_drawWalls::l.b.x = *pdVar1 + dVar12;
        if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
          AM_rotatePoint((double *)&AM_drawWalls::l,&AM_drawWalls::l.a.y);
          AM_rotatePoint(&AM_drawWalls::l.b.x,&AM_drawWalls::l.b.y);
        }
        uVar5 = *(uint *)((long)lines->args + lVar7 + -0xc);
        if ((uVar5 & 0x100) == 0 && am_cheat.Value == 0) {
          if ((allmap) &&
             ((-1 < (char)uVar5 ||
              ((am_showallenabled == true && (bVar11 = CheckCheatmode(false), !bVar11)))))) {
            this = AMColors.c + 0x11;
            goto LAB_00366101;
          }
        }
        else if (((am_cheat.Value != 0 && am_cheat.Value < 4) || ((uVar5 & 0x80) == 0)) ||
                ((am_showallenabled == true && (bVar4 = CheckCheatmode(false), !bVar4)))) {
          if ((int)uVar8 < 1 || bVar11) {
            if ((AMColors.c[0x15].Index < 0) ||
               (((((lVar2 = *(long *)((long)lines->bbox + lVar7 + 0x20), lVar2 == 0 ||
                   (uVar5 = *(uint *)(lVar2 + 0x1f0), (uVar5 >> 0x1e & 1) == 0)) ||
                  (am_map_secrets.Value == 0)) ||
                 (((int)uVar5 < 0 &&
                  ((am_map_secrets.Value != 2 ||
                   ((*(byte *)((long)lines->args + lVar7 + -0xc) & 0x20) != 0)))))) &&
                (((lVar2 = *(long *)((long)lines->bbox + lVar7 + 0x28), lVar2 == 0 ||
                  ((uVar5 = *(uint *)(lVar2 + 0x1f0), (uVar5 >> 0x1e & 1) == 0 ||
                   (am_map_secrets.Value == 0)))) ||
                 (((int)uVar5 < 0 &&
                  ((am_map_secrets.Value != 2 ||
                   ((*(byte *)((long)lines->args + lVar7 + -0xc) & 0x20) != 0)))))))))) {
              if ((*(byte *)((long)lines->args + lVar7 + -0xc) & 0x20) == 0) {
                bVar11 = AM_isTeleportBoundary
                                   ((line_t_conflict *)((long)lines->args + lVar7 + -0x2c));
                if ((bVar11) && (-1 < AMColors.c[0x13].Index)) {
                  this = AMColors.c + 0x13;
                }
                else {
                  bVar11 = AM_isExitBoundary((line_t_conflict *)((long)lines->args + lVar7 + -0x2c))
                  ;
                  if ((bVar11) && (-1 < AMColors.c[0x14].Index)) {
                    this = AMColors.c + 0x14;
                  }
                  else {
                    bVar11 = AM_isLockBoundary((line_t_conflict *)
                                               ((long)lines->args + lVar7 + -0x2c),&local_44);
                    if (bVar11) {
                      if (AMColors.displayLocks == true) {
                        uVar5 = P_GetMapColorForLock(local_44);
                        this = &local_38;
                        if ((int)uVar5 < 0) {
                          local_38 = AMColors.c[0x12];
                        }
                        else {
                          AMColor::FromRGB(this,uVar5 >> 0x10 & 0xff,uVar5 >> 8 & 0xff,uVar5 & 0xff)
                          ;
                        }
                      }
                      else {
                        this = AMColors.c + 0x12;
                      }
                    }
                    else if (((am_showtriggerlines.Value == true) && (-1 < AMColors.c[0xd].Index))
                            && (bVar11 = AM_isTriggerBoundary
                                                   ((line_t_conflict *)
                                                    ((long)lines->args + lVar7 + -0x2c)), bVar11)) {
                      this = AMColors.c + 0xd;
                    }
                    else {
                      lVar2 = *(long *)((long)lines->bbox + lVar7 + 0x28);
                      if (lVar2 == 0) goto LAB_003660f3;
                      bVar11 = secplane_t::operator!=
                                         ((secplane_t *)(lVar2 + 0xb0),
                                          (secplane_t *)
                                          (*(long *)((long)lines->bbox + lVar7 + 0x20) + 0xb0));
                      if (bVar11) {
                        this = AMColors.c + 4;
                      }
                      else {
                        bVar11 = secplane_t::operator!=
                                           ((secplane_t *)
                                            (*(long *)((long)lines->bbox + lVar7 + 0x28) + 0xd8),
                                            (secplane_t *)
                                            (*(long *)((long)lines->bbox + lVar7 + 0x20) + 0xd8));
                        if (bVar11) {
                          AM_drawMline(&AM_drawWalls::l,AMColors.c + 5);
                          goto LAB_0036610d;
                        }
                        bVar11 = AM_Check3DFloors((line_t_conflict *)
                                                  ((long)lines->args + lVar7 + -0x2c));
                        if (bVar11) {
                          this = AMColors.c + 6;
                        }
                        else {
                          if (2 < am_cheat.Value - 1U) goto LAB_0036610d;
                          this = AMColors.c + 3;
                        }
                      }
                    }
                  }
                }
              }
              else if ((am_cheat.Value == 0) || (*(long *)((long)lines->bbox + lVar7 + 0x28) == 0))
              {
LAB_003660f3:
                this = AMColors.c + 2;
              }
              else {
                this = AMColors.c + 0xe;
              }
            }
            else {
              this = AMColors.c + 0x15;
            }
          }
          else {
            this = AMColors.c + 0x16;
          }
LAB_00366101:
          AM_drawMline(&AM_drawWalls::l,this);
        }
      }
      else if ((int)local_40 == 0) {
        dVar12 = 0.0;
        dVar13 = 0.0;
        if ((uVar5 == MapPortalGroup) || (am_portaloverlay.Value == false)) goto LAB_00365dd7;
      }
LAB_0036610d:
      lVar7 = lVar7 + 0x98;
    }
  } while( true );
}

Assistant:

void AM_drawWalls (bool allmap)
{
	int i;
	static mline_t l;
	int lock, color;

	int numportalgroups = am_portaloverlay ? Displacements.size : 0;

	for (int p = numportalgroups - 1; p >= -1; p--)
	{
		if (p == MapPortalGroup) continue;


		for (i = 0; i < numlines; i++)
		{
			int pg;
			
			if (lines[i].sidedef[0]->Flags & WALLF_POLYOBJ)
			{
				// For polyobjects we must test the surrounding sector to get the proper group.
				pg = P_PointInSector(lines[i].v1->fX() + lines[i].Delta().X / 2, lines[i].v1->fY() + lines[i].Delta().Y / 2)->PortalGroup;
			}
			else
			{
				pg = lines[i].frontsector->PortalGroup;
			}
			DVector2 offset;
			bool portalmode = numportalgroups > 0 &&  pg != MapPortalGroup;
			if (pg == p)
			{
				offset = Displacements.getOffset(pg, MapPortalGroup);
			}
			else if (p == -1 && (pg == MapPortalGroup || !am_portaloverlay))
			{
				offset = { 0, 0 };
			}
			else continue;

			l.a.x = (lines[i].v1->fX() + offset.X);
			l.a.y = (lines[i].v1->fY() + offset.Y);
			l.b.x = (lines[i].v2->fX() + offset.X);
			l.b.y = (lines[i].v2->fY() + offset.Y);

			if (am_rotate == 1 || (am_rotate == 2 && viewactive))
			{
				AM_rotatePoint(&l.a.x, &l.a.y);
				AM_rotatePoint(&l.b.x, &l.b.y);
			}

			if (am_cheat != 0 || (lines[i].flags & ML_MAPPED))
			{
				if ((lines[i].flags & ML_DONTDRAW) && (am_cheat == 0 || am_cheat >= 4))
				{
					if (!am_showallenabled || CheckCheatmode(false))
					{
						continue;
					}
				}

				if (portalmode)
				{
					AM_drawMline(&l, AMColors.PortalColor);
				}
				else if (AM_CheckSecret(&lines[i]))
				{
					// map secret sectors like Boom
					AM_drawMline(&l, AMColors.SecretSectorColor);
				}
				else if (lines[i].flags & ML_SECRET)
				{ // secret door
					if (am_cheat != 0 && lines[i].backsector != NULL)
						AM_drawMline(&l, AMColors.SecretWallColor);
					else
						AM_drawMline(&l, AMColors.WallColor);
				}
				else if (AM_isTeleportBoundary(lines[i]) && AMColors.isValid(AMColors.IntraTeleportColor))
				{ // intra-level teleporters
					AM_drawMline(&l, AMColors.IntraTeleportColor);
				}
				else if (AM_isExitBoundary(lines[i]) && AMColors.isValid(AMColors.InterTeleportColor))
				{ // inter-level/game-ending teleporters
					AM_drawMline(&l, AMColors.InterTeleportColor);
				}
				else if (AM_isLockBoundary(lines[i], &lock))
				{
					if (AMColors.displayLocks)
					{
						color = P_GetMapColorForLock(lock);

						AMColor c;

						if (color >= 0)	c.FromRGB(RPART(color), GPART(color), BPART(color));
						else c = AMColors[AMColors.LockedColor];

						AM_drawMline(&l, c);
					}
					else
					{
						AM_drawMline(&l, AMColors.LockedColor);  // locked special
					}
				}
				else if (am_showtriggerlines
					&& AMColors.isValid(AMColors.SpecialWallColor)
					&& AM_isTriggerBoundary(lines[i]))
				{
					AM_drawMline(&l, AMColors.SpecialWallColor);	// wall with special non-door action the player can do
				}
				else if (lines[i].backsector == NULL)
				{
					AM_drawMline(&l, AMColors.WallColor);	// one-sided wall
				}
				else if (lines[i].backsector->floorplane
					!= lines[i].frontsector->floorplane)
				{
					AM_drawMline(&l, AMColors.FDWallColor); // floor level change
				}
				else if (lines[i].backsector->ceilingplane
					!= lines[i].frontsector->ceilingplane)
				{
					AM_drawMline(&l, AMColors.CDWallColor); // ceiling level change
				}
				else if (AM_Check3DFloors(&lines[i]))
				{
					AM_drawMline(&l, AMColors.EFWallColor); // Extra floor border
				}
				else if (am_cheat > 0 && am_cheat < 4)
				{
					AM_drawMline(&l, AMColors.TSWallColor);
				}
			}
			else if (allmap)
			{
				if ((lines[i].flags & ML_DONTDRAW) && (am_cheat == 0 || am_cheat >= 4))
				{
					if (!am_showallenabled || CheckCheatmode(false))
					{
						continue;
					}
				}
				AM_drawMline(&l, AMColors.NotSeenColor);
			}
		}
	}
}